

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_DRBG.c
# Opt level: O0

_Bool EverCrypt_DRBG_generate
                (uint8_t *output,EverCrypt_DRBG_state_s *st,uint32_t n,uint8_t *additional_input,
                uint32_t additional_input_len)

{
  undefined8 in_R9;
  char cVar1;
  EverCrypt_DRBG_state_s scrut;
  uint32_t additional_input_len_local;
  uint8_t *additional_input_local;
  uint32_t n_local;
  EverCrypt_DRBG_state_s *st_local;
  uint8_t *output_local;
  
  cVar1 = (char)*(undefined8 *)st;
  if (cVar1 == '\0') {
    output_local._7_1_ = generate_sha1(output,st,n,additional_input,additional_input_len);
  }
  else if (cVar1 == '\x01') {
    output_local._7_1_ = generate_sha2_256(output,st,n,additional_input,additional_input_len);
  }
  else if (cVar1 == '\x02') {
    output_local._7_1_ = generate_sha2_384(output,st,n,additional_input,additional_input_len);
  }
  else {
    if (cVar1 != '\x03') {
      fprintf(_stderr,"KaRaMeL abort at %s:%d\n%s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/EverCrypt_DRBG.c"
              ,0x7b5,"unreachable (pattern matches are exhaustive in F*)",in_R9,*(undefined8 *)st,
              (st->field_1).case_SHA1_s.k,(st->field_1).case_SHA1_s.v,
              (st->field_1).case_SHA1_s.reseed_counter);
      exit(0xff);
    }
    output_local._7_1_ = generate_sha2_512(output,st,n,additional_input,additional_input_len);
  }
  return output_local._7_1_;
}

Assistant:

bool
EverCrypt_DRBG_generate(
  uint8_t *output,
  EverCrypt_DRBG_state_s *st,
  uint32_t n,
  uint8_t *additional_input,
  uint32_t additional_input_len
)
{
  EverCrypt_DRBG_state_s scrut = *st;
  if (scrut.tag == SHA1_s)
  {
    return generate_sha1(output, st, n, additional_input, additional_input_len);
  }
  if (scrut.tag == SHA2_256_s)
  {
    return generate_sha2_256(output, st, n, additional_input, additional_input_len);
  }
  if (scrut.tag == SHA2_384_s)
  {
    return generate_sha2_384(output, st, n, additional_input, additional_input_len);
  }
  if (scrut.tag == SHA2_512_s)
  {
    return generate_sha2_512(output, st, n, additional_input, additional_input_len);
  }
  KRML_HOST_EPRINTF("KaRaMeL abort at %s:%d\n%s\n",
    __FILE__,
    __LINE__,
    "unreachable (pattern matches are exhaustive in F*)");
  KRML_HOST_EXIT(255U);
}